

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

BtorSimBitVector * btorsim_bv_eq(BtorSimBitVector *a,BtorSimBitVector *b)

{
  long lVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint uVar4;
  BtorSimBitVector *pBVar5;
  long lVar6;
  bool bVar7;
  
  pBVar5 = btorsim_bv_new(1);
  uVar4 = a->len;
  bVar7 = uVar4 != 0;
  if (bVar7) {
    if (a[1].width == b[1].width) {
      lVar6 = 0;
      do {
        if (uVar4 - 1 == (int)lVar6) goto LAB_0011467b;
        puVar2 = &a[1].len + lVar6;
        lVar1 = lVar6 + 1;
        puVar3 = &b[1].len + lVar6;
        lVar6 = lVar1;
      } while (*puVar2 == *puVar3);
      bVar7 = (uint)lVar1 < uVar4;
    }
    if (bVar7) {
      (&pBVar5[1].width)[pBVar5->len - 1] = (&pBVar5[1].width)[pBVar5->len - 1] & 0xfffffffe;
      return pBVar5;
    }
  }
LAB_0011467b:
  (&pBVar5[1].width)[pBVar5->len - 1] = (&pBVar5[1].width)[pBVar5->len - 1] | 1;
  return pBVar5;
}

Assistant:

BtorSimBitVector *
btorsim_bv_eq (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  uint32_t i, bit;
  BtorSimBitVector *res;

  res = btorsim_bv_new (1);
  bit = 1;
  for (i = 0; i < a->len; i++)
  {
    if (a->bits[i] != b->bits[i])
    {
      bit = 0;
      break;
    }
  }
  btorsim_bv_set_bit (res, 0, bit);

  assert (rem_bits_zero_dbg (res));
  return res;
}